

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall Assimp::BVHLoader::~BVHLoader(BVHLoader *this)

{
  BVHLoader *this_local;
  
  ~BVHLoader(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

BVHLoader::~BVHLoader()
{}